

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void http_handle_redirect(nng_http *conn,void *data,nng_aio *aio)

{
  char *pcVar1;
  int iVar2;
  nng_err result;
  char *__s1;
  size_t __n;
  char *local_38;
  char *loc;
  
  local_38 = (char *)0x0;
  pcVar1 = *(char **)((long)data + 0x10);
  __s1 = nni_http_get_uri(conn);
  __n = strlen(pcVar1);
  iVar2 = strncmp(__s1,pcVar1,__n);
  pcVar1 = *(char **)((long)data + 8);
  if ((iVar2 != 0) ||
     (result = nni_asprintf(&local_38,"%s%s",*(char **)((long)data + 8),__s1 + __n),
     pcVar1 = local_38, result == NNG_OK)) {
    local_38 = pcVar1;
    result = nni_http_set_redirect(conn,*data,(char *)0x0,local_38);
    if ((result == NNG_OK) &&
       (result = nni_http_set_header(conn,"Connection","close"), result == NNG_OK)) {
      nng_http_set_status(conn,*data,(char *)0x0);
      if (local_38 != *(char **)((long)data + 8)) {
        nni_strfree(local_38);
      }
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
    if (local_38 != *(char **)((long)data + 8)) {
      nni_strfree(local_38);
    }
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
http_handle_redirect(nng_http *conn, void *data, nng_aio *aio)
{
	char          *loc = NULL;
	http_redirect *hr  = data;
	int            rv;
	const char    *base;
	const char    *uri;

	base = hr->from; // base uri
	uri  = nni_http_get_uri(conn);

	// If we are doing a full tree, then include the entire suffix.
	if (strncmp(uri, base, strlen(base)) == 0) {
		rv = nni_asprintf(&loc, "%s%s", hr->where, uri + strlen(base));
		if (rv != NNG_OK) {
			nni_aio_finish_error(aio, rv);
			return;
		}
	} else {
		loc = hr->where;
	}

	// Build a response.  We always close the connection for redirects,
	// because it is probably going to another server.  This also
	// keeps us from having to consume the entity body, we can just
	// discard it.
	if (((rv = nni_http_set_redirect(conn, hr->code, NULL, loc)) != 0) ||
	    ((rv = nni_http_set_header(conn, "Connection", "close")) != 0)) {
		if (loc != hr->where) {
			nni_strfree(loc);
		}
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, hr->code, NULL);

	if (loc != hr->where) {
		nni_strfree(loc);
	}
	nni_aio_finish(aio, NNG_OK, 0);
}